

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ed25519-donna-batchverify.h
# Opt level: O0

int ed25519_sign_open_batch(uchar **m,size_t *mlen,uchar **pk,uchar **RS,size_t num,int *valid)

{
  int iVar1;
  int *local_7238;
  uint local_722c;
  uchar local_7228 [4];
  int ret;
  uchar hram [64];
  size_t batchsize;
  size_t i;
  bignum256modm *r_scalars;
  ge25519 p;
  batch_heap batch;
  int *local_38;
  int *valid_local;
  size_t num_local;
  uchar **RS_local;
  uchar **pk_local;
  size_t *mlen_local;
  uchar **m_local;
  
  local_722c = 0;
  for (batchsize = 0; local_38 = valid, valid_local = (int *)num, num_local = (size_t)RS,
      RS_local = pk, pk_local = (uchar **)mlen, mlen_local = (size_t *)m, batchsize < num;
      batchsize = batchsize + 1) {
    valid[batchsize] = 1;
  }
  do {
    if (valid_local < (int *)0x4) {
      for (batchsize = 0; batchsize < valid_local; batchsize = batchsize + 1) {
        iVar1 = ed25519_sign_open((uchar *)mlen_local[batchsize],(size_t)pk_local[batchsize],
                                  RS_local[batchsize],*(uchar **)(num_local + batchsize * 8));
        local_38[batchsize] = (uint)(iVar1 == 0);
        local_722c = local_38[batchsize] ^ 1U | local_722c;
      }
      return local_722c;
    }
    if (valid_local < (int *)0x41) {
      local_7238 = valid_local;
    }
    else {
      local_7238 = (int *)0x40;
    }
    ed25519_randombytes_unsafe(p.t + 4,(long)local_7238 << 4);
    for (batchsize = 0; batchsize < local_7238; batchsize = batchsize + 1) {
      expand256_modm(batch.scalars[(long)local_7238 + batchsize] + 4,batch.r[batchsize - 1] + 8,0x10
                    );
    }
    for (batchsize = 0; batchsize < local_7238; batchsize = batchsize + 1) {
      expand256_modm(batch.scalars[batchsize - 1] + 4,
                     (uchar *)(*(long *)(num_local + batchsize * 8) + 0x20),0x20);
      mul256_modm(batch.scalars[batchsize - 1] + 4,batch.scalars[batchsize - 1] + 4,
                  batch.scalars[(long)local_7238 + batchsize] + 4);
    }
    for (batchsize = 1; batchsize < local_7238; batchsize = batchsize + 1) {
      add256_modm(batch.points[0x80].t + 4,batch.points[0x80].t + 4,batch.scalars[batchsize - 1] + 4
                 );
    }
    for (batchsize = 0; batchsize < local_7238; batchsize = batchsize + 1) {
      ed25519_hram(local_7228,*(uchar **)(num_local + batchsize * 8),RS_local[batchsize],
                   (uchar *)mlen_local[batchsize],(size_t)pk_local[batchsize]);
      expand256_modm(batch.scalars[batchsize] + 4,local_7228,0x40);
      mul256_modm(batch.scalars[batchsize] + 4,batch.scalars[batchsize] + 4,
                  batch.scalars[(long)local_7238 + batchsize] + 4);
    }
    memcpy(batch.r[0x80] + 8,&ge25519_basepoint,0xa0);
    for (batchsize = 0; batchsize < local_7238; batchsize = batchsize + 1) {
      iVar1 = ge25519_unpack_negative_vartime
                        ((ge25519 *)(batch.points[batchsize].t + 4),RS_local[batchsize]);
      if (iVar1 == 0) goto LAB_003fd343;
    }
    for (batchsize = 0; batchsize < local_7238; batchsize = batchsize + 1) {
      iVar1 = ge25519_unpack_negative_vartime
                        ((ge25519 *)(batch.points[batchsize + (long)local_7238].t + 4),
                         *(uchar **)(num_local + batchsize * 8));
      if (iVar1 == 0) goto LAB_003fd343;
    }
    ge25519_multi_scalarmult_vartime
              ((ge25519 *)&r_scalars,(batch_heap *)(p.t + 4),(long)local_7238 * 2 + 1);
    iVar1 = ge25519_is_neutral_vartime((ge25519 *)&r_scalars);
    if (iVar1 == 0) {
      local_722c = local_722c | 2;
LAB_003fd343:
      for (batchsize = 0; batchsize < local_7238; batchsize = batchsize + 1) {
        iVar1 = ed25519_sign_open((uchar *)mlen_local[batchsize],(size_t)pk_local[batchsize],
                                  RS_local[batchsize],*(uchar **)(num_local + batchsize * 8));
        local_38[batchsize] = (uint)(iVar1 == 0);
        local_722c = local_38[batchsize] ^ 1U | local_722c;
      }
    }
    mlen_local = mlen_local + (long)local_7238;
    pk_local = pk_local + (long)local_7238;
    RS_local = RS_local + (long)local_7238;
    num_local = (long)local_7238 * 8 + num_local;
    valid_local = (int *)((long)valid_local - (long)local_7238);
    local_38 = local_38 + (long)local_7238;
  } while( true );
}

Assistant:

int
ED25519_FN(ed25519_sign_open_batch) (const unsigned char **m, size_t *mlen, const unsigned char **pk, const unsigned char **RS, size_t num, int *valid) {
	batch_heap ALIGN(16) batch;
	ge25519 ALIGN(16) p;
	bignum256modm *r_scalars;
	size_t i, batchsize;
	unsigned char hram[64];
	int ret = 0;

	for (i = 0; i < num; i++)
		valid[i] = 1;

	while (num > 3) {
		batchsize = (num > max_batch_size) ? max_batch_size : num;

		/* generate r (scalars[batchsize+1]..scalars[2*batchsize] */
		ED25519_FN(ed25519_randombytes_unsafe) (batch.r, batchsize * 16);
		r_scalars = &batch.scalars[batchsize + 1];
		for (i = 0; i < batchsize; i++)
			expand256_modm(r_scalars[i], batch.r[i], 16);

		/* compute scalars[0] = ((r1s1 + r2s2 + ...)) */
		for (i = 0; i < batchsize; i++) {
			expand256_modm(batch.scalars[i], RS[i] + 32, 32);
			mul256_modm(batch.scalars[i], batch.scalars[i], r_scalars[i]);
		}
		for (i = 1; i < batchsize; i++)
			add256_modm(batch.scalars[0], batch.scalars[0], batch.scalars[i]);

		/* compute scalars[1]..scalars[batchsize] as r[i]*H(R[i],A[i],m[i]) */
		for (i = 0; i < batchsize; i++) {
			ed25519_hram(hram, RS[i], pk[i], m[i], mlen[i]);
			expand256_modm(batch.scalars[i+1], hram, 64);
			mul256_modm(batch.scalars[i+1], batch.scalars[i+1], r_scalars[i]);
		}

		/* compute points */
		batch.points[0] = ge25519_basepoint;
		for (i = 0; i < batchsize; i++)
			if (!ge25519_unpack_negative_vartime(&batch.points[i+1], pk[i]))
				goto fallback;
		for (i = 0; i < batchsize; i++)
			if (!ge25519_unpack_negative_vartime(&batch.points[batchsize+i+1], RS[i]))
				goto fallback;

		ge25519_multi_scalarmult_vartime(&p, &batch, (batchsize * 2) + 1);
		if (!ge25519_is_neutral_vartime(&p)) {
			ret |= 2;

			fallback:
			for (i = 0; i < batchsize; i++) {
				valid[i] = ED25519_FN(ed25519_sign_open) (m[i], mlen[i], pk[i], RS[i]) ? 0 : 1;
				ret |= (valid[i] ^ 1);
			}
		}

		m += batchsize;
		mlen += batchsize;
		pk += batchsize;
		RS += batchsize;
		num -= batchsize;
		valid += batchsize;
	}

	for (i = 0; i < num; i++) {
		valid[i] = ED25519_FN(ed25519_sign_open) (m[i], mlen[i], pk[i], RS[i]) ? 0 : 1;
		ret |= (valid[i] ^ 1);
	}

	return ret;
}